

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_layer_interface.cpp
# Opt level: O1

XrResult ApiLayerInterface::LoadApiLayers
                   (string *openxr_command,uint32_t enabled_api_layer_count,
                   char **enabled_api_layer_names,
                   vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                   *api_layer_interfaces)

{
  ApiLayerManifestFile *pAVar1;
  size_t __n;
  ManifestFile *this;
  pointer pcVar2;
  iterator __position;
  pointer puVar3;
  pointer puVar4;
  undefined8 uVar5;
  vector<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>,std::allocator<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>>>
  *pvVar6;
  pointer puVar7;
  bool bVar8;
  XrResult XVar9;
  int iVar10;
  XrResult XVar11;
  const_iterator cVar12;
  iterator __position_00;
  LoaderPlatformLibraryHandle layer_library;
  string *psVar13;
  code *pcVar14;
  ostream *poVar15;
  char *pcVar16;
  ApiLayerInterface *pAVar17;
  undefined8 extraout_RAX;
  pointer pXVar18;
  XrResult XVar19;
  pointer pXVar20;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *p_Var21;
  pointer *__ptr;
  long lVar22;
  pointer puVar23;
  bool bVar24;
  unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
  *enabled_layer_manifest_file;
  XrExtensionProperties *ext_prop;
  undefined8 uVar25;
  XrNegotiateApiLayerRequest api_layer_info;
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> extension_properties;
  string function_name;
  XrNegotiateLoaderInfo loader_info;
  string error_message;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layers_already_found;
  undefined1 local_2f8 [32];
  PFN_xrGetInstanceProcAddr local_2d8;
  PFN_xrCreateApiLayerInstance p_Stack_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  char **local_2a8;
  pointer local_2a0;
  undefined1 local_298 [32];
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_278;
  undefined8 uStack_260;
  undefined8 local_258;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_248;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  local_228;
  vector<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>,std::allocator<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>>>
  *local_210;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  local_208;
  undefined1 local_1e8 [112];
  ios_base local_178 [272];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_2a0 = (pointer)CONCAT44(local_2a0._4_4_,enabled_api_layer_count);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_208.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8 = enabled_api_layer_names;
  local_210 = (vector<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>,std::allocator<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>>>
               *)api_layer_interfaces;
  XVar9 = ApiLayerManifestFile::FindManifestFiles
                    (openxr_command,MANIFEST_TYPE_IMPLICIT_API_LAYER,&local_208);
  puVar7 = local_208.
           super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_208.
      super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_208.
      super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pXVar18 = (pointer)local_208.
                       super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_1e8._0_8_ = &local_68;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_68,((_Alloc_hider *)&pXVar18->handle)->_M_p + 0xa8,local_1e8);
      pXVar18 = (pointer)&pXVar18->type;
    } while (pXVar18 != (pointer)puVar7);
  }
  local_228.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *)0x0;
  local_228.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *)0x0;
  local_228.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar8 = true;
  if ((XR_ERROR_VALIDATION_FAILURE < XVar9) &&
     (XVar9 = ApiLayerManifestFile::FindManifestFiles
                        (openxr_command,MANIFEST_TYPE_EXPLICIT_API_LAYER,&local_228),
     XR_ERROR_VALIDATION_FAILURE < XVar9)) {
    local_278.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_278.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    AddEnvironmentApiLayers
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_278);
    if ((int)local_2a0 == 0) {
LAB_00106a9d:
      if (local_278.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_278.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        bVar24 = true;
        bVar8 = true;
      }
      else {
        bVar8 = true;
        local_2a0 = local_278.
                    super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        pXVar18 = local_278.
                  super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pXVar20 = local_278.
                  super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        do {
          cVar12 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find(&local_68,(key_type *)pXVar18);
          if (cVar12.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            if (local_228.
                super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_228.
                super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              bVar24 = false;
              __position_00._M_current =
                   local_228.
                   super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              do {
                pAVar1 = ((__position_00._M_current)->_M_t).
                         super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                         .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl;
                __n = *(size_t *)&pXVar18->type;
                lVar22 = 8;
                if ((__n == (pAVar1->_layer_name)._M_string_length) &&
                   ((__n == 0 ||
                    (iVar10 = memcmp(((_Alloc_hider *)&pXVar18->handle)->_M_p,
                                     (pAVar1->_layer_name)._M_dataplus._M_p,__n), iVar10 == 0)))) {
                  local_1e8._0_8_ = &local_68;
                  std::
                  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  ::
                  _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              *)&local_68,pXVar18,local_1e8);
                  std::
                  vector<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>,std::allocator<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>>
                  ::
                  emplace_back<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>
                            ((vector<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>,std::allocator<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>>
                              *)&local_208,__position_00._M_current);
                  __position_00 =
                       std::
                       vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                       ::_M_erase(&local_228,__position_00);
                  bVar24 = true;
                  lVar22 = 0;
                }
                __position_00._M_current =
                     (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *
                     )((long)&((__position_00._M_current)->_M_t).
                              super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                              .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl +
                      lVar22);
              } while (__position_00._M_current !=
                       local_228.
                       super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
              pXVar20 = local_2a0;
              if (bVar24) goto LAB_00106c22;
            }
            local_1e8._0_8_ =
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)(local_1e8 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1e8,
                       "ApiLayerInterface::LoadApiLayers - failed to find layer ","");
            std::__cxx11::string::_M_append
                      ((char *)local_1e8,(ulong)((_Alloc_hider *)&pXVar18->handle)->_M_p);
            local_2f8._0_8_ = (pointer)0x0;
            local_2f8._8_8_ = (pointer)0x0;
            local_2f8._16_8_ = (pointer)0x0;
            LoaderLogger::LogErrorMessage
                      (openxr_command,(string *)local_1e8,
                       (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_2f8)
            ;
            std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                      ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_2f8)
            ;
            if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_1e8._0_8_ !=
                (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_1e8 + 0x10)) {
              operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
            }
            bVar8 = false;
          }
LAB_00106c22:
          pXVar18 = (pointer)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)&pXVar18->name)->_M_local_buf + 0x10);
        } while (pXVar18 != pXVar20);
        bVar24 = true;
      }
    }
    else {
      if (local_2a8 != (char **)0x0) {
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<char_const*const*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (local_2a8,local_2a8 + ((ulong)local_2a0 & 0xffffffff),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_278);
        goto LAB_00106a9d;
      }
      p_Var21 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_1e8 + 0x10);
      local_1e8._0_8_ = p_Var21;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xrCreateInstance","");
      pXVar18 = (pointer)(local_2f8 + 0x10);
      local_2f8._0_8_ = pXVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f8,
                 "VUID-XrInstanceCreateInfo-enabledApiLayerNames-parameter: enabledApiLayerCount is non-0 but array is NULL"
                 ,"");
      local_298._0_8_ = (pointer)0x0;
      local_298._8_8_ = (pointer)0x0;
      local_298._16_8_ = (pointer)0x0;
      LoaderLogger::LogErrorMessage
                ((string *)local_1e8,(string *)local_2f8,
                 (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_298);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_298);
      if ((pointer)local_2f8._0_8_ != pXVar18) {
        operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
      }
      if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)local_1e8._0_8_ != p_Var21) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
      local_1e8._0_8_ = p_Var21;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xrCreateInstance","");
      local_2f8._0_8_ = pXVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f8,
                 "VUID-xrCreateInstance-info-parameter: something wrong with XrInstanceCreateInfo contents"
                 ,"");
      local_298._0_8_ =
           (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            *)0x0;
      local_298._8_8_ = (pointer)0x0;
      local_298._16_8_ = (pointer)0x0;
      LoaderLogger::LogErrorMessage
                ((string *)local_1e8,(string *)local_2f8,
                 (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_298);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_298);
      if ((pointer)local_2f8._0_8_ != pXVar18) {
        operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
      }
      if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)local_1e8._0_8_ != p_Var21) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
      bVar8 = true;
      bVar24 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_278);
    XVar9 = XR_ERROR_VALIDATION_FAILURE;
    if (!bVar24) goto LAB_001075bb;
  }
  local_2a0 = (pointer)local_208.
                       super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  if (local_208.
      super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_208.
      super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    XVar19 = XR_SUCCESS;
  }
  else {
    XVar9 = XR_SUCCESS;
    XVar19 = XR_SUCCESS;
    local_2a8 = (char **)0x0;
    pXVar18 = (pointer)local_208.
                       super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    do {
      layer_library =
           (LoaderPlatformLibraryHandle)
           dlopen(*(undefined8 *)(((_Alloc_hider *)&pXVar18->handle)->_M_p + 0x28),1);
      if (layer_library == (LoaderPlatformLibraryHandle)0x0) {
        if (((ulong)local_2a8 & 1) == 0) {
          XVar9 = XR_ERROR_FILE_ACCESS_ERROR;
          XVar19 = XR_ERROR_FILE_ACCESS_ERROR;
        }
        pcVar16 = (char *)dlerror();
        std::__cxx11::string::string((string *)local_1e8,pcVar16,(allocator *)local_2f8);
        local_2f8._0_8_ = local_2f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2f8,"ApiLayerInterface::LoadApiLayers skipping layer ","");
        std::__cxx11::string::_M_append
                  ((char *)local_2f8,*(ulong *)(((_Alloc_hider *)&pXVar18->handle)->_M_p + 0xa8));
        std::__cxx11::string::append((char *)local_2f8);
        std::__cxx11::string::_M_append((char *)local_2f8,local_1e8._0_8_);
        std::__cxx11::string::append((char *)local_2f8);
        local_278.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_278.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_278.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        LoaderLogger::LogWarningMessage(openxr_command,(string *)local_2f8,&local_278);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_278);
        if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
          operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
        }
        pXVar20 = (pointer)local_1e8._16_8_;
        p_Var21 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_1e8._0_8_;
        if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)local_1e8._0_8_ !=
            (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)(local_1e8 + 0x10)) goto LAB_00107553;
      }
      else {
        this = (ManifestFile *)((_Alloc_hider *)&pXVar18->handle)->_M_p;
        local_1e8._0_8_ = local_1e8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"xrNegotiateLoaderApiLayerInterface","");
        psVar13 = ManifestFile::GetFunctionName(this,(string *)local_1e8);
        local_298._0_8_ = local_298 + 0x10;
        pcVar2 = (psVar13->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_298,pcVar2,pcVar2 + psVar13->_M_string_length);
        if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)local_1e8._0_8_ !=
            (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)(local_1e8 + 0x10)) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
        if ((pointer)local_298._8_8_ == (pointer)0x0) {
          __assert_fail("!name.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK/src/loader/loader_platform.hpp"
                        ,0x40,
                        "void *LoaderPlatformLibraryGetProcAddr(LoaderPlatformLibraryHandle, const std::string &)"
                       );
        }
        pcVar14 = (code *)dlsym(layer_library,local_298._0_8_);
        if (pcVar14 == (code *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8,"ApiLayerInterface::LoadApiLayers skipping layer ",0x30);
          pcVar2 = ((_Alloc_hider *)&pXVar18->handle)->_M_p;
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,*(char **)(pcVar2 + 0xa8),
                               *(long *)(pcVar2 + 0xb0));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15," because negotiation function ",0x1e);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,(char *)local_298._0_8_,local_298._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," was not found",0xe);
          std::__cxx11::stringbuf::str();
          local_278.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_278.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_278.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          LoaderLogger::LogErrorMessage(openxr_command,(string *)local_2f8,&local_278);
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_278);
          if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
            operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
          }
          dlclose(layer_library);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          std::ios_base::~ios_base(local_178);
          XVar19 = XR_ERROR_API_LAYER_NOT_PRESENT;
        }
        else {
          local_278.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x100000001;
          local_278.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x28;
          local_278.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x100000001;
          uStack_260 = 0x1000000000000;
          local_258 = 0x103ff00000fff;
          local_2d8 = (PFN_xrGetInstanceProcAddr)0x0;
          p_Stack_2d0 = (PFN_xrCreateApiLayerInstance)0x0;
          local_2f8._16_8_ = (pointer)0x0;
          local_2f8._24_8_ = 0;
          local_2f8._0_8_ = (pointer)0x100000002;
          local_2f8._8_8_ = (pointer)0x30;
          XVar11 = (*pcVar14)(&local_278,
                              *(undefined8 *)(((_Alloc_hider *)&pXVar18->handle)->_M_p + 0xa8),
                              local_2f8);
          if ((XR_ERROR_VALIDATION_FAILURE < XVar11) &&
             (local_2d8 == (PFN_xrGetInstanceProcAddr)0x0)) {
            local_1e8._0_8_ = local_1e8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1e8,"ApiLayerInterface::LoadApiLayers skipping layer ","");
            std::__cxx11::string::_M_append
                      ((char *)local_1e8,*(ulong *)(((_Alloc_hider *)&pXVar18->handle)->_M_p + 0xa8)
                      );
            std::__cxx11::string::append((char *)local_1e8);
            local_2c8._M_allocated_capacity = 0;
            local_2c8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_2b8._M_allocated_capacity = 0;
            LoaderLogger::LogWarningMessage
                      (openxr_command,(string *)local_1e8,
                       (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_2c8
                      );
            std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                      ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_2c8
                      );
            if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_1e8._0_8_ !=
                (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_1e8 + 0x10)) {
              operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
            }
            XVar11 = XR_ERROR_FILE_CONTENTS_INVALID;
          }
          if (XVar11 < XR_SUCCESS) {
            XVar19 = XVar9;
            if (((ulong)local_2a8 & 1) == 0) {
              XVar19 = XVar11;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e8,"ApiLayerInterface::LoadApiLayers skipping layer ",0x30)
            ;
            pcVar2 = ((_Alloc_hider *)&pXVar18->handle)->_M_p;
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,*(char **)(pcVar2 + 0xa8),
                                 *(long *)(pcVar2 + 0xb0));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15," due to failed negotiation with error ",0x26);
            std::ostream::operator<<(poVar15,XVar11);
            std::__cxx11::stringbuf::str();
            local_248.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_248.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_248.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            LoaderLogger::LogWarningMessage(openxr_command,(string *)&local_2c8,&local_248);
            std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                      (&local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_allocated_capacity != &local_2b8) {
              operator_delete((void *)local_2c8._M_allocated_capacity,
                              local_2b8._M_allocated_capacity + 1);
            }
            dlclose(layer_library);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            std::ios_base::~ios_base(local_178);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e8,
                       "ApiLayerInterface::LoadApiLayers succeeded loading layer ",0x39);
            pvVar6 = local_210;
            pcVar2 = ((_Alloc_hider *)&pXVar18->handle)->_M_p;
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,*(char **)(pcVar2 + 0xa8),
                                 *(long *)(pcVar2 + 0xb0));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15," using interface version ",0x19);
            poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15," and OpenXR API version ",0x18);
            poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,".",1);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
            std::__cxx11::stringbuf::str();
            local_248.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_248.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_248.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            LoaderLogger::LogInfoMessage(openxr_command,(string *)&local_2c8,&local_248);
            std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                      (&local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_allocated_capacity != &local_2b8) {
              operator_delete((void *)local_2c8._M_allocated_capacity,
                              local_2b8._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            std::ios_base::~ios_base(local_178);
            local_1e8._16_8_ = 0;
            local_1e8._0_8_ =
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)0x0;
            local_1e8._8_8_ = 0;
            local_2b8._M_allocated_capacity = 0;
            local_2c8._M_allocated_capacity = 0;
            local_2c8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            ManifestFile::GetInstanceExtensionProperties
                      ((ManifestFile *)((_Alloc_hider *)&pXVar18->handle)->_M_p,
                       (vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> *)
                       &local_2c8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1e8,
                      ((long)(local_2c8._8_8_ - local_2c8._0_8_) >> 3) * -0x79435e50d79435e5);
            uVar5 = local_2c8._8_8_;
            for (uVar25 = local_2c8._M_allocated_capacity; uVar25 != uVar5; uVar25 = uVar25 + 0x98)
            {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char(&)[128]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_1e8,(char (*) [128])(uVar25 + 0x10));
            }
            pAVar17 = (ApiLayerInterface *)operator_new(0x58);
            ApiLayerInterface(pAVar17,(string *)(((_Alloc_hider *)&pXVar18->handle)->_M_p + 0xa8),
                              layer_library,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1e8,local_2d8,p_Stack_2d0);
            __position._M_current =
                 *(unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_> **)
                  (pvVar6 + 8);
            local_248.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)pAVar17;
            if (__position._M_current ==
                *(unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_> **)
                 (pvVar6 + 0x10)) {
              std::
              vector<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>,std::allocator<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>>>
              ::_M_realloc_insert<ApiLayerInterface*>
                        (pvVar6,__position,(ApiLayerInterface **)&local_248);
            }
            else {
              ((__position._M_current)->_M_t).
              super___uniq_ptr_impl<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>._M_t
              .super__Tuple_impl<0UL,_ApiLayerInterface_*,_std::default_delete<ApiLayerInterface>_>.
              super__Head_base<0UL,_ApiLayerInterface_*,_false>._M_head_impl = pAVar17;
              *(long *)(pvVar6 + 8) = *(long *)(pvVar6 + 8) + 8;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_allocated_capacity !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete((void *)local_2c8._M_allocated_capacity,
                              local_2b8._M_allocated_capacity - local_2c8._0_8_);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1e8);
            XVar19 = XR_SUCCESS;
            local_2a8 = (char **)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
        }
        pXVar20 = (pointer)local_298._16_8_;
        p_Var21 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_298._0_8_;
        XVar9 = XVar19;
        if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)local_298._0_8_ !=
            (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)(local_298 + 0x10)) {
LAB_00107553:
          operator_delete(p_Var21,(ulong)((long)&pXVar20->handle + 1));
        }
      }
      pXVar18 = (pointer)&pXVar18->type;
    } while (pXVar18 != local_2a0);
  }
  pvVar6 = local_210;
  XVar9 = XR_ERROR_API_LAYER_NOT_PRESENT;
  if (bVar8) {
    XVar9 = XVar19;
  }
  if (XVar9 < XR_SUCCESS) {
    puVar3 = *(pointer *)local_210;
    puVar4 = *(pointer *)(local_210 + 8);
    puVar23 = puVar3;
    if (puVar4 != puVar3) {
      do {
        pAVar17 = (puVar23->_M_t).
                  super___uniq_ptr_impl<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_ApiLayerInterface_*,_std::default_delete<ApiLayerInterface>_>
                  .super__Head_base<0UL,_ApiLayerInterface_*,_false>._M_head_impl;
        if (pAVar17 != (ApiLayerInterface *)0x0) {
          (*pAVar17->_vptr_ApiLayerInterface[1])();
        }
        (puVar23->_M_t).
        super___uniq_ptr_impl<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>._M_t.
        super__Tuple_impl<0UL,_ApiLayerInterface_*,_std::default_delete<ApiLayerInterface>_>.
        super__Head_base<0UL,_ApiLayerInterface_*,_false>._M_head_impl = (ApiLayerInterface *)0x0;
        puVar23 = puVar23 + 1;
      } while (puVar23 != puVar4);
      *(pointer *)(pvVar6 + 8) = puVar3;
    }
  }
LAB_001075bb:
  std::
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ::~vector(&local_228);
  std::
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ::~vector(&local_208);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  return XVar9;
}

Assistant:

XrResult ApiLayerInterface::LoadApiLayers(const std::string& openxr_command, uint32_t enabled_api_layer_count,
                                          const char* const* enabled_api_layer_names,
                                          std::vector<std::unique_ptr<ApiLayerInterface>>& api_layer_interfaces) {
    XrResult last_error = XR_SUCCESS;
    std::unordered_set<std::string> layers_already_found;

    bool any_loaded = false;
    std::vector<std::unique_ptr<ApiLayerManifestFile>> enabled_layer_manifest_files_in_init_order = {};

    // Find any implicit layers.
    XrResult result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_IMPLICIT_API_LAYER,
                                                              enabled_layer_manifest_files_in_init_order);

    for (const auto& enabled_layer_manifest_file : enabled_layer_manifest_files_in_init_order) {
        layers_already_found.insert(enabled_layer_manifest_file->LayerName());
    }

    // Find any explicit layers.
    std::vector<std::unique_ptr<ApiLayerManifestFile>> explicit_layer_manifest_files = {};

    if (XR_SUCCEEDED(result)) {
        result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_EXPLICIT_API_LAYER,
                                                         explicit_layer_manifest_files);
    }

    bool found_all_layers = true;

    if (XR_SUCCEEDED(result)) {
        // Put all explicit and then xrCreateInstance enabled layers into a string vector

        std::vector<std::string> enabled_explicit_api_layer_names = {};

        AddEnvironmentApiLayers(enabled_explicit_api_layer_names);

        if (enabled_api_layer_count > 0) {
            if (nullptr == enabled_api_layer_names) {
                LoaderLogger::LogErrorMessage(
                    "xrCreateInstance",
                    "VUID-XrInstanceCreateInfo-enabledApiLayerNames-parameter: enabledApiLayerCount is non-0 but array is NULL");
                LoaderLogger::LogErrorMessage(
                    "xrCreateInstance", "VUID-xrCreateInstance-info-parameter: something wrong with XrInstanceCreateInfo contents");
                return XR_ERROR_VALIDATION_FAILURE;
            }

            std::copy(enabled_api_layer_names, enabled_api_layer_names + enabled_api_layer_count,
                      std::back_inserter(enabled_explicit_api_layer_names));
        }

        // add explicit layers to list of layers to enable
        for (const auto& layer_name : enabled_explicit_api_layer_names) {
            bool found_this_layer = false;

            if (layers_already_found.count(layer_name) > 0) {
                found_this_layer = true;
            } else {
                for (auto it = explicit_layer_manifest_files.begin(); it != explicit_layer_manifest_files.end();) {
                    bool erased_layer_manifest_file = false;

                    if (layer_name == (*it)->LayerName()) {
                        found_this_layer = true;
                        layers_already_found.insert(layer_name);
                        enabled_layer_manifest_files_in_init_order.push_back(std::move(*it));
                        it = explicit_layer_manifest_files.erase(it);
                        erased_layer_manifest_file = true;
                    }

                    if (!erased_layer_manifest_file) {
                        it++;
                    }
                }
            }

            // If even one of the layers wasn't found, we want to return an error
            if (!found_this_layer) {
                found_all_layers = false;
                std::string error_message = "ApiLayerInterface::LoadApiLayers - failed to find layer ";
                error_message += layer_name;
                LoaderLogger::LogErrorMessage(openxr_command, error_message);
            }
        }
    }

    for (std::unique_ptr<ApiLayerManifestFile>& manifest_file : enabled_layer_manifest_files_in_init_order) {
        LoaderPlatformLibraryHandle layer_library = LoaderPlatformLibraryOpen(manifest_file->LibraryPath());
        if (nullptr == layer_library) {
            if (!any_loaded) {
                last_error = XR_ERROR_FILE_ACCESS_ERROR;
            }
            std::string library_message = LoaderPlatformLibraryOpenError(manifest_file->LibraryPath());
            std::string warning_message = "ApiLayerInterface::LoadApiLayers skipping layer ";
            warning_message += manifest_file->LayerName();
            warning_message += ", failed to load with message \"";
            warning_message += library_message;
            warning_message += "\"";
            LoaderLogger::LogWarningMessage(openxr_command, warning_message);
            continue;
        }
#ifdef XR_KHR_LOADER_INIT_SUPPORT
        if (!LoaderInitData::instance().initialized()) {
            LoaderLogger::LogErrorMessage(openxr_command, "ApiLayerInterface::LoadApiLayers skipping manifest file " +
                                                              manifest_file->Filename() +
                                                              " because xrInitializeLoaderKHR was not yet called.");

            LoaderPlatformLibraryClose(layer_library);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        bool forwardedInitLoader = false;
        {
            // If we have xrInitializeLoaderKHR exposed as an export, forward call to it.
            const auto function_name = manifest_file->GetFunctionName("xrInitializeLoaderKHR");
            auto initLoader =
                reinterpret_cast<PFN_xrInitializeLoaderKHR>(LoaderPlatformLibraryGetProcAddr(layer_library, function_name));
            if (initLoader != nullptr) {
                // we found the entry point one way or another.
                LoaderLogger::LogInfoMessage(openxr_command,
                                             "ApiLayerInterface::LoadApiLayers forwarding xrInitializeLoaderKHR call to API layer "
                                             "before calling xrNegotiateLoaderApiLayerInterface.");
                XrResult res = initLoader(LoaderInitData::instance().getParam());
                if (!XR_SUCCEEDED(res)) {
                    LoaderLogger::LogErrorMessage(
                        openxr_command, "ApiLayerInterface::LoadApiLayers forwarded call to xrInitializeLoaderKHR failed.");

                    LoaderPlatformLibraryClose(layer_library);
                    return res;
                }
                forwardedInitLoader = true;
            }
        }
#endif

        // Get and settle on an layer interface version (using any provided name if required).
        std::string function_name = manifest_file->GetFunctionName("xrNegotiateLoaderApiLayerInterface");
        auto negotiate = reinterpret_cast<PFN_xrNegotiateLoaderApiLayerInterface>(
            LoaderPlatformLibraryGetProcAddr(layer_library, function_name));

        if (nullptr == negotiate) {
            std::ostringstream oss;
            oss << "ApiLayerInterface::LoadApiLayers skipping layer " << manifest_file->LayerName()
                << " because negotiation function " << function_name << " was not found";
            LoaderLogger::LogErrorMessage(openxr_command, oss.str());
            LoaderPlatformLibraryClose(layer_library);
            last_error = XR_ERROR_API_LAYER_NOT_PRESENT;
            continue;
        }

        // Loader info for negotiation
        XrNegotiateLoaderInfo loader_info = {};
        loader_info.structType = XR_LOADER_INTERFACE_STRUCT_LOADER_INFO;
        loader_info.structVersion = XR_LOADER_INFO_STRUCT_VERSION;
        loader_info.structSize = sizeof(XrNegotiateLoaderInfo);
        loader_info.minInterfaceVersion = 1;
        loader_info.maxInterfaceVersion = XR_CURRENT_LOADER_API_LAYER_VERSION;
        loader_info.minApiVersion = XR_MAKE_VERSION(1, 0, 0);
        loader_info.maxApiVersion = XR_MAKE_VERSION(1, 0x3ff, 0xfff);  // Maximum allowed version for this major version.

        // Set up the layer return structure
        XrNegotiateApiLayerRequest api_layer_info = {};
        api_layer_info.structType = XR_LOADER_INTERFACE_STRUCT_API_LAYER_REQUEST;
        api_layer_info.structVersion = XR_API_LAYER_INFO_STRUCT_VERSION;
        api_layer_info.structSize = sizeof(XrNegotiateApiLayerRequest);

        XrResult res = negotiate(&loader_info, manifest_file->LayerName().c_str(), &api_layer_info);
        // If we supposedly succeeded, but got a nullptr for getInstanceProcAddr
        // then something still went wrong, so return with an error.
        if (XR_SUCCEEDED(res) && nullptr == api_layer_info.getInstanceProcAddr) {
            std::string warning_message = "ApiLayerInterface::LoadApiLayers skipping layer ";
            warning_message += manifest_file->LayerName();
            warning_message += ", negotiation did not return a valid getInstanceProcAddr";
            LoaderLogger::LogWarningMessage(openxr_command, warning_message);
            res = XR_ERROR_FILE_CONTENTS_INVALID;
        }

#ifdef XR_KHR_LOADER_INIT_SUPPORT
        if (XR_SUCCEEDED(res) && !forwardedInitLoader) {
            // Forward initialize loader call, where possible and if we did not do so before.
            PFN_xrVoidFunction initializeVoid = nullptr;
            PFN_xrInitializeLoaderKHR initialize = nullptr;

            // Now we may try asking xrGetInstanceProcAddr on the API layer
            if (XR_SUCCEEDED(api_layer_info.getInstanceProcAddr(XR_NULL_HANDLE, "xrInitializeLoaderKHR", &initializeVoid))) {
                if (initializeVoid == nullptr) {
                    LoaderLogger::LogErrorMessage(openxr_command,
                                                  "ApiLayerInterface::LoadApiLayers got success from xrGetInstanceProcAddr "
                                                  "for xrInitializeLoaderKHR, but output a null pointer.");
                    res = XR_ERROR_RUNTIME_FAILURE;
                } else {
                    initialize = reinterpret_cast<PFN_xrInitializeLoaderKHR>(initializeVoid);
                }
            }
            if (initialize != nullptr) {
                // we found the entry point one way or another.
                LoaderLogger::LogInfoMessage(openxr_command,
                                             "ApiLayerInterface::LoadApiLayers forwarding xrInitializeLoaderKHR call to API layer "
                                             "after calling xrNegotiateLoaderApiLayerInterface.");
                res = initialize(LoaderInitData::instance().getParam());
                if (!XR_SUCCEEDED(res)) {
                    LoaderLogger::LogErrorMessage(
                        openxr_command, "ApiLayerInterface::LoadApiLayers forwarded call to xrInitializeLoaderKHR failed.");
                }
            }
        }
#endif

        if (XR_FAILED(res)) {
            if (!any_loaded) {
                last_error = res;
            }
            std::ostringstream oss;
            oss << "ApiLayerInterface::LoadApiLayers skipping layer " << manifest_file->LayerName()
                << " due to failed negotiation with error " << res;
            LoaderLogger::LogWarningMessage(openxr_command, oss.str());
            LoaderPlatformLibraryClose(layer_library);
            continue;
        }

        {
            std::ostringstream oss;
            oss << "ApiLayerInterface::LoadApiLayers succeeded loading layer " << manifest_file->LayerName()
                << " using interface version " << api_layer_info.layerInterfaceVersion << " and OpenXR API version "
                << XR_VERSION_MAJOR(api_layer_info.layerApiVersion) << "." << XR_VERSION_MINOR(api_layer_info.layerApiVersion);
            LoaderLogger::LogInfoMessage(openxr_command, oss.str());
        }

        // Grab the list of extensions this layer supports for easy filtering after the
        // xrCreateInstance call
        std::vector<std::string> supported_extensions;
        std::vector<XrExtensionProperties> extension_properties;
        manifest_file->GetInstanceExtensionProperties(extension_properties);
        supported_extensions.reserve(extension_properties.size());
        for (XrExtensionProperties& ext_prop : extension_properties) {
            supported_extensions.emplace_back(ext_prop.extensionName);
        }

        // Add this API layer to the vector
        api_layer_interfaces.emplace_back(new ApiLayerInterface(manifest_file->LayerName(), layer_library, supported_extensions,
                                                                api_layer_info.getInstanceProcAddr,
                                                                api_layer_info.createApiLayerInstance));

        // If we load one, clear all errors.
        any_loaded = true;
        last_error = XR_SUCCESS;
    }

    // Set error here to preserve prior error behavior
    if (!found_all_layers) {
        last_error = XR_ERROR_API_LAYER_NOT_PRESENT;
    }

    // If we failed catastrophically for some reason, clean up everything.
    if (XR_FAILED(last_error)) {
        api_layer_interfaces.clear();
    }

    return last_error;
}